

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::ScratchAllocator::allocate_raw(ScratchAllocator *this,size_t size,size_t alignment)

{
  ulong uVar1;
  Impl *this_00;
  pointer pBVar2;
  pointer puVar3;
  ulong uVar4;
  ulong local_20;
  
  this_00 = this->impl;
  if ((this_00->blocks).
      super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this_00->blocks).
      super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_20 = 0x10000;
    if (0x10000 < alignment + size) {
      local_20 = alignment + size;
    }
    std::
    vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
    ::emplace_back<unsigned_long&>
              ((vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
                *)this_00,&local_20);
  }
  pBVar2 = (this->impl->blocks).
           super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = pBVar2[-1].blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar4 = -alignment & (alignment + pBVar2[-1].offset) - 1;
  uVar1 = uVar4 + size;
  if ((ulong)((long)pBVar2[-1].blob.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3) < uVar1) {
    local_20 = 0x10000;
    if (0x10000 < alignment + size) {
      local_20 = alignment + size;
    }
    std::
    vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
    ::emplace_back<unsigned_long&>
              ((vector<Fossilize::ScratchAllocator::Impl::Block,std::allocator<Fossilize::ScratchAllocator::Impl::Block>>
                *)this->impl,&local_20);
    puVar3 = (pointer)allocate_raw(this,size,alignment);
  }
  else {
    puVar3 = puVar3 + uVar4;
    pBVar2[-1].offset = uVar1;
  }
  return puVar3;
}

Assistant:

void *ScratchAllocator::allocate_raw(size_t size, size_t alignment)
{
	if (impl->blocks.empty())
		impl->add_block(size + alignment);

	auto &block = impl->blocks.back();

	size_t offset = (block.offset + alignment - 1) & ~(alignment - 1);
	size_t required_size = offset + size;
	if (required_size <= block.blob.size())
	{
		void *ret = block.blob.data() + offset;
		block.offset = required_size;
		return ret;
	}

	impl->add_block(size + alignment);
	return allocate_raw(size, alignment);
}